

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitboard.cc
# Opt level: O2

void board::bitboard::print(uint64_t bb)

{
  int i;
  uint uVar1;
  char *pcVar2;
  
  for (uVar1 = 0; uVar1 != 0x40; uVar1 = uVar1 + 1) {
    if ((uVar1 & 7) == 0) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    pcVar2 = "X";
    if ((bb & 1) == 0) {
      pcVar2 = "-";
    }
    std::operator<<((ostream *)&std::cout,pcVar2);
    bb = bb >> 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void board::bitboard::print(uint64_t bb)
{
    for (int i = 0; i < 64; i++) {
        if (i % 8 == 0) {
            std::cout << std::endl;
        }
        if (bb & 1ULL) {
            std::cout << "X";
        }
        else {
            std::cout << "-";
        }
        bb = bb >> 1;
    }
    std::cout << std::endl;
}